

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpdf-c.cc
# Opt level: O2

char * qpdf_oh_get_string_value(qpdf_data qpdf,qpdf_oh oh)

{
  char *pcVar1;
  char *local_50;
  _Any_data local_48;
  code *local_38;
  code *local_30;
  _Any_data local_28;
  code *local_18;
  code *local_10;
  
  local_28._8_8_ = 0;
  local_28._M_unused._M_object = &local_50;
  local_50 = "";
  local_10 = std::
             _Function_handler<const_char_*(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf-c.cc:865:12)>
             ::_M_invoke;
  local_18 = std::
             _Function_handler<const_char_*(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf-c.cc:865:12)>
             ::_M_manager;
  local_48._8_8_ = 0;
  local_30 = std::
             _Function_handler<const_char_*(QPDFObjectHandle_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf-c.cc:1312:46)>
             ::_M_invoke;
  local_38 = std::
             _Function_handler<const_char_*(QPDFObjectHandle_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf-c.cc:1312:46)>
             ::_M_manager;
  local_48._M_unused._M_object = qpdf;
  pcVar1 = do_with_oh<char_const*>
                     (qpdf,oh,(function<const_char_*()> *)&local_28,
                      (function<const_char_*(QPDFObjectHandle_&)> *)&local_48);
  std::_Function_base::~_Function_base((_Function_base *)&local_48);
  std::_Function_base::~_Function_base((_Function_base *)&local_28);
  return pcVar1;
}

Assistant:

char const*
qpdf_oh_get_string_value(qpdf_data qpdf, qpdf_oh oh)
{
    return do_with_oh<char const*>(
        qpdf, oh, return_T<char const*>(""), [qpdf](QPDFObjectHandle& o) {
            QTC::TC("qpdf", "qpdf-c called qpdf_oh_get_string_value");
            qpdf->tmp_string = o.getStringValue();
            return qpdf->tmp_string.c_str();
        });
}